

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_file.c
# Opt level: O3

lu_int lu_file_compress(lu_int nlines,lu_int *begin,lu_int *end,lu_int *next,lu_int *index,
                       double *value,double stretch,lu_int pad)

{
  int iVar1;
  int iVar2;
  lu_int lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  iVar4 = next[nlines];
  lVar3 = 0;
  iVar7 = 0;
  if (iVar4 < nlines) {
    lVar3 = 0;
    iVar6 = 0;
    iVar7 = 0;
    do {
      iVar6 = iVar6 + iVar7;
      iVar1 = begin[iVar4];
      lVar8 = (long)iVar1;
      iVar2 = end[iVar4];
      iVar7 = iVar1;
      if (iVar6 < iVar1) {
        iVar7 = iVar6;
      }
      begin[iVar4] = iVar7;
      if (iVar1 < iVar2) {
        if (iVar1 < iVar6) {
          iVar6 = iVar1;
        }
        lVar5 = 0;
        do {
          index[iVar6 + lVar5] = index[lVar8 + lVar5];
          value[iVar6 + lVar5] = value[lVar8 + lVar5];
          lVar5 = lVar5 + 1;
        } while (iVar2 - lVar8 != lVar5);
        iVar7 = iVar6 + (int)lVar5;
      }
      iVar6 = (int)((double)(iVar2 - iVar1) * stretch + (double)pad);
      end[iVar4] = iVar7;
      lVar3 = lVar3 + (iVar2 - iVar1);
      iVar4 = next[iVar4];
    } while (iVar4 < nlines);
    iVar7 = iVar7 + iVar6;
  }
  iVar4 = begin[nlines];
  if (iVar7 < begin[nlines]) {
    iVar4 = iVar7;
  }
  begin[nlines] = iVar4;
  return lVar3;
}

Assistant:

lu_int lu_file_compress(
    lu_int nlines, lu_int *begin, lu_int *end, const lu_int *next,
    lu_int *index, double *value, double stretch, lu_int pad)
{
    lu_int i, pos, ibeg, iend, used, extra_space, nz = 0;

    used = 0; extra_space = 0;
    for (i = next[nlines]; i < nlines; i = next[i]) /* move line i */
    {
        ibeg = begin[i];
        iend = end[i];
        assert(ibeg >= used);
        used += extra_space;
        if (used > ibeg)
            used = ibeg;        /* chop extra space added before */
        begin[i] = used;
        for (pos = ibeg; pos < iend; pos++)
        {
            index[used] = index[pos];
            value[used++] = value[pos];
        }
        end[i] = used;
        extra_space = stretch*(iend-ibeg) + pad;
        nz += iend-ibeg;
    }
    assert(used <= begin[nlines]);
    used += extra_space;
    if (used > begin[nlines])
        used = begin[nlines];   /* never use more space than before */
    begin[nlines] = used;
    return nz;
}